

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangical.cpp
# Opt level: O1

int __thiscall
icu_63::DangiCalendar::clone
          (DangiCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ChineseCalendar *this_00;
  
  this_00 = (ChineseCalendar *)UMemory::operator_new((UMemory *)0x270,(size_t)__fn);
  if (this_00 == (ChineseCalendar *)0x0) {
    this_00 = (ChineseCalendar *)0x0;
  }
  else {
    ChineseCalendar::ChineseCalendar(this_00,&this->super_ChineseCalendar);
    (this_00->super_Calendar).super_UObject._vptr_UObject =
         (_func_int **)&PTR__DangiCalendar_003e4538;
  }
  return (int)this_00;
}

Assistant:

Calendar*
DangiCalendar::clone() const
{
    return new DangiCalendar(*this);
}